

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_control_impl.cc
# Opt level: O3

void __thiscall
webrtc::GainControlImpl::Initialize
          (GainControlImpl *this,size_t num_proc_channels,int sample_rate_hz)

{
  Mode mode;
  int minimum_capture_level;
  int maximum_capture_level;
  unsigned_long *puVar1;
  GainController *pGVar2;
  int *piVar3;
  __uniq_ptr_impl<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
  *this_00;
  CritScope cs_capture;
  CritScope cs_render;
  CritScope local_50;
  CritScope local_48;
  Optional<int> *local_40;
  __uniq_ptr_impl<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
  *local_38;
  
  rtc::CritScope::CritScope(&local_48,this->crit_render_);
  rtc::CritScope::CritScope(&local_50,this->crit_capture_);
  (this->num_proc_channels_).value_ = num_proc_channels;
  (this->num_proc_channels_).has_value_ = true;
  (this->sample_rate_hz_).value_ = sample_rate_hz;
  (this->sample_rate_hz_).has_value_ = true;
  if (this->enabled_ != false) {
    puVar1 = rtc::Optional<unsigned_long>::operator*(&this->num_proc_channels_);
    std::
    vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
    ::resize(&this->gain_controllers_,*puVar1);
    this_00 = (__uniq_ptr_impl<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
               *)(this->gain_controllers_).
                 super__Vector_base<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (__uniq_ptr_impl<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                *)(this->gain_controllers_).
                  super__Vector_base<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != local_38) {
      local_40 = &this->sample_rate_hz_;
      do {
        pGVar2 = (this_00->_M_t).
                 super__Tuple_impl<0UL,_webrtc::GainControlImpl::GainController_*,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                 .super__Head_base<0UL,_webrtc::GainControlImpl::GainController_*,_false>.
                 _M_head_impl;
        if (pGVar2 == (GainController *)0x0) {
          pGVar2 = (GainController *)operator_new(0x10);
          GainController::GainController(pGVar2);
          std::
          __uniq_ptr_impl<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
          ::reset(this_00,pGVar2);
          pGVar2 = (this_00->_M_t).
                   super__Tuple_impl<0UL,_webrtc::GainControlImpl::GainController_*,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                   .super__Head_base<0UL,_webrtc::GainControlImpl::GainController_*,_false>.
                   _M_head_impl;
        }
        mode = this->mode_;
        minimum_capture_level = this->minimum_capture_level_;
        maximum_capture_level = this->maximum_capture_level_;
        piVar3 = rtc::Optional<int>::operator*(local_40);
        GainController::Initialize
                  (pGVar2,minimum_capture_level,maximum_capture_level,mode,*piVar3,
                   this->analog_capture_level_);
        this_00 = this_00 + 1;
      } while (this_00 != local_38);
    }
    Configure(this);
    AllocateRenderQueue(this);
  }
  rtc::CritScope::~CritScope(&local_50);
  rtc::CritScope::~CritScope(&local_48);
  return;
}

Assistant:

void GainControlImpl::Initialize(size_t num_proc_channels, int sample_rate_hz) {
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  num_proc_channels_ = rtc::Optional<size_t>(num_proc_channels);
  sample_rate_hz_ = rtc::Optional<int>(sample_rate_hz);

  if (!enabled_) {
    return;
  }

  gain_controllers_.resize(*num_proc_channels_);
  for (auto& gain_controller : gain_controllers_) {
    if (!gain_controller) {
      gain_controller.reset(new GainController());
    }
    gain_controller->Initialize(minimum_capture_level_, maximum_capture_level_,
                                mode_, *sample_rate_hz_, analog_capture_level_);
  }

  Configure();

  AllocateRenderQueue();
}